

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

long add_blk_move(MIR_context_t ctx,MIR_item_t_conflict func_item,MIR_insn_t_conflict before,
                 MIR_op_t dest,MIR_op_t src,size_t src_size,long label_num)

{
  MIR_func_t func_00;
  MIR_reg_t MVar1;
  MIR_reg_t MVar2;
  ulong i;
  MIR_op_t local_2a8;
  MIR_op_t local_278;
  MIR_op_t local_248;
  MIR_op_t local_218;
  MIR_op_t local_1e8;
  MIR_op_t local_1b8;
  MIR_insn_t_conflict local_188;
  MIR_label_t skip;
  MIR_label_t loop;
  MIR_op_t temp;
  MIR_op_t step;
  MIR_op_t disp;
  MIR_op_t addr;
  undefined1 auStack_a8 [4];
  MIR_reg_t addr_reg;
  undefined1 auStack_78 [8];
  MIR_op_t size;
  MIR_insn_t_conflict insn;
  size_t blk_size;
  MIR_func_t func;
  long label_num_local;
  size_t src_size_local;
  MIR_insn_t_conflict before_local;
  MIR_item_t_conflict func_item_local;
  MIR_context_t ctx_local;
  
  func_00 = (func_item->u).func;
  i = src_size + 7 & 0xfffffffffffffff8;
  MVar1 = new_temp_reg(ctx,MIR_T_I64,func_00);
  MIR_new_reg_op((MIR_op_t *)auStack_78,ctx,MVar1);
  MIR_new_int_op((MIR_op_t *)auStack_a8,ctx,i);
  size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_MOV);
  MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
  size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_ALLOCA);
  MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
  func = (MIR_func_t)label_num;
  if (i != 0) {
    MVar1 = new_temp_reg(ctx,MIR_T_I64,func_00);
    MIR_new_reg_op((MIR_op_t *)((long)&disp.u + 0x18),ctx,MVar1);
    MVar2 = new_temp_reg(ctx,MIR_T_I64,func_00);
    MIR_new_reg_op((MIR_op_t *)((long)&step.u + 0x18),ctx,MVar2);
    MVar2 = new_temp_reg(ctx,MIR_T_I64,func_00);
    MIR_new_reg_op((MIR_op_t *)((long)&temp.u + 0x18),ctx,MVar2);
    MVar2 = new_temp_reg(ctx,MIR_T_I64,func_00);
    MIR_new_reg_op((MIR_op_t *)&loop,ctx,MVar2);
    skip = create_label(ctx,label_num);
    func = (MIR_func_t)(label_num + 2);
    local_188 = create_label(ctx,label_num + 1);
    MIR_new_int_op(&local_1b8,ctx,0);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_MOV);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_new_label_op(&local_1e8,ctx,local_188);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_BLE);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_insert_insn_before(ctx,func_item,before,skip);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_ADD);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_new_mem_op(&local_218,ctx,MIR_T_I64,0,MVar1,0,'\x01');
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_MOV);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_ADD);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_new_mem_op(&local_248,ctx,MIR_T_I64,0,MVar1,0,'\x01');
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_MOV);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_new_int_op(&local_278,ctx,8);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_MOV);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_ADD);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_new_label_op(&local_2a8,ctx,skip);
    size.u.mem.disp = (MIR_disp_t)MIR_new_insn(ctx,MIR_BLT);
    MIR_insert_insn_before(ctx,func_item,before,(MIR_insn_t_conflict)size.u.mem.disp);
    MIR_insert_insn_before(ctx,func_item,before,local_188);
  }
  return (long)func;
}

Assistant:

static long add_blk_move (MIR_context_t ctx, MIR_item_t func_item, MIR_insn_t before, MIR_op_t dest,
                          MIR_op_t src, size_t src_size, long label_num) {
  MIR_func_t func = func_item->u.func;
  size_t blk_size = (src_size + 7) / 8 * 8;
  MIR_insn_t insn;
  MIR_op_t size = MIR_new_reg_op (ctx, new_temp_reg (ctx, MIR_T_I64, func));

  insn = MIR_new_insn (ctx, MIR_MOV, size, MIR_new_int_op (ctx, blk_size));
  MIR_insert_insn_before (ctx, func_item, before, insn);
  insn = MIR_new_insn (ctx, MIR_ALLOCA, dest, size);
  MIR_insert_insn_before (ctx, func_item, before, insn);
  if (blk_size != 0) {
    MIR_reg_t addr_reg = new_temp_reg (ctx, MIR_T_I64, func);
    MIR_op_t addr = MIR_new_reg_op (ctx, addr_reg);
    MIR_op_t disp = MIR_new_reg_op (ctx, new_temp_reg (ctx, MIR_T_I64, func));
    MIR_op_t step = MIR_new_reg_op (ctx, new_temp_reg (ctx, MIR_T_I64, func));
    MIR_op_t temp = MIR_new_reg_op (ctx, new_temp_reg (ctx, MIR_T_I64, func));
    MIR_label_t loop = create_label (ctx, label_num++), skip = create_label (ctx, label_num++);

    insn = MIR_new_insn (ctx, MIR_MOV, disp, MIR_new_int_op (ctx, 0));
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_BLE, MIR_new_label_op (ctx, skip), size, disp);
    MIR_insert_insn_before (ctx, func_item, before, insn);
    MIR_insert_insn_before (ctx, func_item, before, loop);
    insn = MIR_new_insn (ctx, MIR_ADD, addr, src, disp);
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_MOV, temp, MIR_new_mem_op (ctx, MIR_T_I64, 0, addr_reg, 0, 1));
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_ADD, addr, dest, disp);
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_MOV, MIR_new_mem_op (ctx, MIR_T_I64, 0, addr_reg, 0, 1), temp);
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_MOV, step, MIR_new_int_op (ctx, 8));
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_ADD, disp, disp, step);
    MIR_insert_insn_before (ctx, func_item, before, insn);
    insn = MIR_new_insn (ctx, MIR_BLT, MIR_new_label_op (ctx, loop), disp, size);
    MIR_insert_insn_before (ctx, func_item, before, insn);
    MIR_insert_insn_before (ctx, func_item, before, skip);
  }
  return label_num;
}